

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyZipExtractFromBuf(SyArchive *pArch,char *zBuf,sxu32 nLen)

{
  SyArchiveEntry **ppSVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  SyArchiveEntry *pSVar6;
  ushort uVar7;
  ushort uVar8;
  long lVar9;
  sxi32 sVar10;
  uint uVar11;
  int iVar12;
  sxu32 sVar13;
  sxu32 sVar14;
  SyArchiveEntry *__s;
  SyArchiveEntry **ppSVar15;
  SyArchiveEntry **ppSVar16;
  sxu32 *psVar17;
  int *piVar18;
  SyArchiveEntry *pSVar19;
  SyArchiveEntry **ppSVar20;
  uint uVar21;
  long lVar22;
  ushort uVar23;
  int iVar24;
  uint uVar25;
  char *pcVar26;
  int *piVar27;
  bool bVar28;
  int *local_80;
  ulong local_78;
  SyArchiveEntry *local_70;
  SyString local_48;
  char *local_38;
  
  sVar10 = -0x18;
  if (0x61 < nLen) {
    uVar11 = nLen - 0x16;
    local_80 = (int *)(zBuf + uVar11);
    piVar18 = local_80;
    if ((uVar11 != 0) && (sVar10 = SyMemcmp(local_80,"PK\x05\x06",4), sVar10 != 0)) {
      piVar18 = (int *)(zBuf + uVar11);
      lVar9 = 1;
      do {
        lVar22 = lVar9;
        piVar18 = (int *)((long)piVar18 + -1);
        if ((piVar18 <= zBuf) || (0x8014 < (int)lVar22 + 0x16U)) break;
        sVar10 = SyMemcmp(piVar18,"PK\x05\x06",4);
        lVar9 = lVar22 + 1;
      } while (sVar10 != 0);
      local_80 = (int *)((long)local_80 - lVar22);
    }
    sVar10 = -0x18;
    if ((*piVar18 == 0x6054b50) &&
       (*(short *)&pArch->nEntry = (short)piVar18[2], pArch->nEntry < 0x8000)) {
      bVar5 = *(byte *)((long)piVar18 + 0xf);
      pArch->nCentralSize = piVar18[3];
      bVar28 = false;
      if (-1 < (int)((uint)bVar5 << 0x18)) {
        pArch->nCentralOfft = piVar18[4];
        bVar28 = true;
        sVar10 = 0;
      }
    }
    else {
      bVar28 = false;
    }
    if (bVar28) {
      piVar18 = (int *)((long)piVar18 - (long)(int)pArch->nCentralSize);
      if ((piVar18 <= zBuf) || (sVar10 = SyMemcmp(piVar18,"PK\x01\x02",4), sVar10 != 0)) {
        if (nLen <= pArch->nCentralOfft) {
          return -0x18;
        }
        piVar18 = (int *)(zBuf + pArch->nCentralOfft);
        sVar10 = SyMemcmp(piVar18,"PK\x01\x02",4);
        if (sVar10 != 0) {
          return -0x18;
        }
      }
      uVar11 = (int)local_80 - (int)piVar18;
      if (uVar11 != 0) {
        ppSVar1 = &pArch->pList;
        local_78 = 0;
        piVar27 = piVar18;
        local_38 = zBuf;
LAB_0014075b:
        do {
          __s = (SyArchiveEntry *)SyMemBackendPoolAlloc(pArch->pAllocator,0xa8);
          if (__s == (SyArchiveEntry *)0x0) break;
          uVar23 = 0;
          memset(__s,0,0xa8);
          __s->nMagic = 0xdead635a;
          if (*piVar27 == 0x2014b50) {
            *(short *)&(__s->sFileName).nByte = (short)piVar27[7];
            if (0x7fff < (__s->sFileName).nByte) {
              uVar23 = 0;
              goto LAB_001408a5;
            }
            __s->nExtra = *(sxu16 *)((long)piVar27 + 0x1e);
            uVar23 = *(ushort *)(piVar27 + 8);
            __s->nComprMeth = *(sxu16 *)((long)piVar27 + 10);
            bVar5 = (byte)*(ushort *)(piVar27 + 3);
            bVar2 = *(byte *)((long)piVar27 + 0xd);
            uVar8 = *(ushort *)(piVar27 + 3);
            bVar3 = *(byte *)((long)piVar27 + 0xe);
            bVar4 = *(byte *)((long)piVar27 + 0xf);
            uVar7 = *(ushort *)((long)piVar27 + 0xe);
            (__s->sFmt).tm_isdst = 0;
            (__s->sFmt).tm_year = (bVar4 >> 1) + 0x7bc;
            (__s->sFmt).tm_mday = bVar3 & 0x1f;
            (__s->sFmt).tm_hour = (uint)(bVar2 >> 3);
            (__s->sFmt).tm_min = uVar8 >> 5 & 0x3f;
            (__s->sFmt).tm_sec = (uint)bVar5 + (uint)bVar5 & 0x3e;
            (__s->sFmt).tm_mon = (uVar7 >> 5 & 0xf) - 1;
            __s->nCrc = piVar27[4];
            bVar5 = *(byte *)((long)piVar27 + 0x1b);
            __s->nByte = piVar27[6];
            if (((int)((uint)bVar5 << 0x18) < 0) ||
               (bVar5 = *(byte *)((long)piVar27 + 0x17), __s->nByteCompr = piVar27[5],
               (int)((uint)bVar5 << 0x18) < 0)) goto LAB_001408a5;
            bVar5 = *(byte *)((long)piVar27 + 0x2d);
            __s->nOfft = *(sxu32 *)((long)piVar27 + 0x2a);
            bVar28 = -1 < (int)((uint)bVar5 << 0x18);
          }
          else {
LAB_001408a5:
            bVar28 = false;
          }
          sVar14 = (__s->sFileName).nByte;
          iVar24 = (uint)__s->nExtra + uVar23 + sVar14 + 0x2e;
          iVar12 = (int)local_78;
          if (bVar28) {
            uVar21 = __s->nOfft;
            pcVar26 = local_38 + uVar21;
            sVar10 = SyMemcmp(pcVar26,"PK\x03\x04",4);
            if (sVar10 != 0) goto LAB_001408e4;
            __s->nOfft = *(ushort *)(pcVar26 + 0x1a) + uVar21 + (uint)*(ushort *)(pcVar26 + 0x1c) +
                         0x1e;
            pcVar26 = (char *)((ulong)(iVar12 + 0x2e) + (long)piVar18);
            (__s->sFileName).zString = pcVar26;
            if ((sVar14 != 0) &&
               (((__s->nByte != 0 || (pcVar26[sVar14 - 1] == '/')) &&
                (pcVar26 = SyMemBackendStrDup(pArch->pAllocator,pcVar26,sVar14),
                pcVar26 != (char *)0x0)))) {
              (__s->sFileName).zString = pcVar26;
              sVar14 = (__s->sFileName).nByte;
              sVar13 = (*pArch->xHash)(pcVar26,sVar14);
              pSVar19 = pArch->apHash[pArch->nSize - 1 & sVar13];
              local_48.zString = pcVar26;
              local_48.nByte = sVar14;
              if (pSVar19 == (SyArchiveEntry *)0x0) {
                bVar28 = false;
                pSVar19 = local_70;
              }
              else {
                do {
                  if ((sVar13 == pSVar19->nHash) &&
                     (sVar10 = (*pArch->xCmp)(&local_48,&pSVar19->sFileName), sVar10 == 0)) {
                    bVar28 = true;
                    goto LAB_00140a37;
                  }
                  pSVar19 = pSVar19->pNextHash;
                } while (pSVar19 != (SyArchiveEntry *)0x0);
                bVar28 = false;
                pSVar19 = local_70;
              }
LAB_00140a37:
              if (bVar28) {
                __s->pNextName = pSVar19->pNextName;
                pSVar19->pNextName = __s;
                psVar17 = &pSVar19->nDup;
              }
              else {
                uVar21 = pArch->nSize;
                if (uVar21 * 3 < pArch->nLoaded) {
                  ppSVar15 = (SyArchiveEntry **)SyMemBackendAlloc(pArch->pAllocator,uVar21 << 4);
                  if (ppSVar15 != (SyArchiveEntry **)0x0) {
                    if ((uVar21 & 0xfffffff) != 0) {
                      ppSVar16 = (SyArchiveEntry **)((long)ppSVar15 + (ulong)(uVar21 << 4));
                      ppSVar20 = ppSVar15;
                      do {
                        *(undefined1 *)ppSVar20 = 0;
                        if (ppSVar16 <= (SyArchiveEntry **)((long)ppSVar20 + 1)) break;
                        *(undefined1 *)((long)ppSVar20 + 1) = 0;
                        if (ppSVar16 <= (SyArchiveEntry **)((long)ppSVar20 + 2)) break;
                        *(undefined1 *)((long)ppSVar20 + 2) = 0;
                        if (ppSVar16 <= (SyArchiveEntry **)((long)ppSVar20 + 3)) break;
                        *(undefined1 *)((long)ppSVar20 + 3) = 0;
                        ppSVar20 = (SyArchiveEntry **)((long)ppSVar20 + 4);
                      } while (ppSVar20 < ppSVar16);
                    }
                    sVar14 = pArch->nLoaded;
                    if (sVar14 != 0) {
                      ppSVar20 = ppSVar1;
                      do {
                        pSVar6 = *ppSVar20;
                        pSVar6->pNextHash = (SyArchiveEntry *)0x0;
                        pSVar6->pPrevHash = (SyArchiveEntry *)0x0;
                        uVar25 = pSVar6->nHash & uVar21 * 2 - 1;
                        pSVar6->pNextHash = ppSVar15[uVar25];
                        if (ppSVar15[uVar25] != (SyArchiveEntry *)0x0) {
                          ppSVar15[uVar25]->pPrevHash = pSVar6;
                        }
                        ppSVar15[uVar25] = pSVar6;
                        ppSVar20 = &pSVar6->pNext;
                        sVar14 = sVar14 - 1;
                      } while (sVar14 != 0);
                    }
                    SyMemBackendFree(pArch->pAllocator,pArch->apHash);
                    pArch->apHash = ppSVar15;
                    pArch->nSize = uVar21 * 2;
                  }
                }
                sVar14 = (*pArch->xHash)((__s->sFileName).zString,(__s->sFileName).nByte);
                __s->nHash = sVar14;
                ppSVar15 = pArch->apHash;
                uVar21 = pArch->nSize - 1 & sVar14;
                __s->pNextHash = ppSVar15[uVar21];
                if (ppSVar15[uVar21] != (SyArchiveEntry *)0x0) {
                  ppSVar15[uVar21]->pPrevHash = __s;
                }
                ppSVar15[uVar21] = __s;
                pSVar6 = *ppSVar1;
                if (pSVar6 != (SyArchiveEntry *)0x0) {
                  __s->pNext = pSVar6;
                  pSVar6->pPrev = __s;
                }
                *ppSVar1 = __s;
                psVar17 = &pArch->nLoaded;
              }
              *psVar17 = *psVar17 + 1;
              local_78 = (ulong)(uint)(iVar24 + iVar12);
              piVar27 = (int *)((long)piVar18 + local_78);
              local_70 = pSVar19;
              if (uVar11 <= (uint)(iVar24 + iVar12)) break;
              goto LAB_0014075b;
            }
            SyMemBackendPoolFree(pArch->pAllocator,__s);
          }
          else {
LAB_001408e4:
            local_48.zString = (char *)((ulong)local_48.zString & 0xffffffff00000000);
            SyMemBackendPoolFree(pArch->pAllocator,__s);
            sVar10 = SyBlobSearch((void *)((long)piVar18 + (ulong)(uint)(iVar12 + iVar24)),
                                  uVar11 - (iVar12 + iVar24),"PK\x01\x02",4,(sxu32 *)&local_48);
            iVar24 = iVar24 + (int)local_48.zString;
            if (sVar10 != 0) break;
          }
          local_78 = (ulong)(uint)(iVar24 + iVar12);
          piVar27 = (int *)((long)piVar18 + local_78);
        } while ((uint)(iVar24 + iVar12) < uVar11);
      }
      pArch->pCursor = pArch->pList;
      sVar10 = (uint)(pArch->nLoaded != 0) * 3 + -3;
    }
  }
  return sVar10;
}

Assistant:

JX9_PRIVATE sxi32 SyZipExtractFromBuf(SyArchive *pArch, const char *zBuf, sxu32 nLen)
 {
 	const unsigned char *zCentral, *zEnd;
 	sxi32 rc;
#if defined(UNTRUST)
 	if( SXARCH_INVALID(pArch) || zBuf == 0 ){
 		return SXERR_INVALID;
 	}
#endif 	
 	/* The miminal size of a zip archive:
 	 * LOCAL_HDR_SZ + CENTRAL_HDR_SZ + END_OF_CENTRAL_HDR_SZ
 	 * 		30				46				22
 	 */
 	 if( nLen < SXZIP_LOCAL_HDRSZ + SXZIP_CENTRAL_HDRSZ + SXZIP_END_CENTRAL_HDRSZ ){
 	 	return SXERR_CORRUPT; /* Don't bother processing return immediately */
 	 }
 	  		
 	zEnd = (unsigned char *)&zBuf[nLen - SXZIP_END_CENTRAL_HDRSZ];
 	/* Find the end of central directory */
 	while( ((sxu32)((unsigned char *)&zBuf[nLen] - zEnd) < (SXZIP_END_CENTRAL_HDRSZ + SXI16_HIGH)) &&
		zEnd > (unsigned char *)zBuf && SyMemcmp(zEnd, "PK\005\006", sizeof(sxu32)) != 0 ){
 		zEnd--;
 	} 	
 	/* Parse the end of central directory */
 	rc = ParseEndOfCentralDirectory(&(*pArch), zEnd);
 	if( rc != SXRET_OK ){
 		return rc;
 	} 	
 	
 	/* Find the starting offset of the central directory */
 	zCentral = &zEnd[-(sxi32)pArch->nCentralSize];
 	if( zCentral <= (unsigned char *)zBuf || SyMemcmp(zCentral, "PK\001\002", sizeof(sxu32)) != 0 ){
 		if( pArch->nCentralOfft >= nLen ){
			/* Corrupted central directory offset */
 			return SXERR_CORRUPT;
 		}
 		zCentral = (unsigned char *)&zBuf[pArch->nCentralOfft];
 		if( SyMemcmp(zCentral, "PK\001\002", sizeof(sxu32)) != 0 ){
 			/* Corrupted zip archive */
 			return SXERR_CORRUPT;
 		}
 		/* Fall thru and extract all valid entries from the central directory */
 	}
 	rc = ZipExtract(&(*pArch), zCentral, (sxu32)(zEnd - zCentral), (void *)zBuf);
 	return rc;
 }